

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stonemask.cc
# Opt level: O1

void sptk::world::StoneMask
               (double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
               double *refined_f0)

{
  double initial_f0;
  bool bVar1;
  int iVar2;
  uint uVar3;
  fft_plan p;
  fft_plan p_00;
  undefined1 auVar4 [16];
  long lVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  double *pdVar11;
  void *pvVar12;
  double *power_spectrum;
  double *numerator_i;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  fft_plan *pfVar18;
  undefined8 *puVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  byte bVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  int iVar34;
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined8 auStackY_1b8 [5];
  undefined1 in_stack_fffffffffffffe70 [32];
  undefined4 uVar36;
  undefined4 uVar37;
  ForwardRealFFT local_98;
  long lVar32;
  
  bVar23 = 0;
  if (0 < f0_length) {
    dVar24 = (double)fs;
    uVar16 = 0;
    do {
      initial_f0 = f0[uVar16];
      dVar27 = 0.0;
      if ((40.0 < initial_f0) && (initial_f0 <= dVar24 / 12.0)) {
        dVar27 = temporal_positions[uVar16];
        dVar30 = (dVar24 * 1.5) / initial_f0 + 1.0;
        dVar25 = 0.0;
        iVar22 = (int)dVar30;
        uVar3 = iVar22 * 2;
        uVar21 = (ulong)uVar3;
        iVar2 = iVar22 * 2 + 1;
        lVar5 = (long)iVar2;
        uVar20 = lVar5 * 8;
        if (iVar22 < 0) {
          uVar20 = 0xffffffffffffffff;
        }
        pvVar6 = operator_new__(uVar20);
        auVar4 = _DAT_00116930;
        uVar36 = 0;
        if (-1 < iVar22) {
          uVar14 = 0;
          if (0 < (int)uVar3) {
            uVar14 = (ulong)uVar3;
          }
          auVar28._8_4_ = (int)uVar14;
          auVar28._0_8_ = uVar14;
          auVar28._12_4_ = 0;
          iVar13 = -iVar22;
          lVar15 = 0;
          auVar31 = _DAT_00116920;
          do {
            auVar33 = auVar28 ^ auVar4;
            auVar35 = auVar31 ^ auVar4;
            bVar1 = auVar33._0_4_ < auVar35._0_4_;
            iVar34 = auVar33._4_4_;
            iVar17 = auVar35._4_4_;
            if ((bool)(~(iVar34 < iVar17 || iVar17 == iVar34 && bVar1) & 1)) {
              *(double *)((long)pvVar6 + lVar15) = (double)iVar13 / dVar24;
            }
            if (iVar34 >= iVar17 && (iVar17 != iVar34 || !bVar1)) {
              *(double *)((long)pvVar6 + lVar15 + 8) = (double)(iVar13 + 1) / dVar24;
            }
            lVar32 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 2;
            auVar31._8_8_ = lVar32 + 2;
            lVar15 = lVar15 + 0x10;
            iVar13 = iVar13 + 2;
          } while (uVar14 * 8 + 0x10 != lVar15);
        }
        dVar29 = (double)(int)dVar25;
        dVar30 = (double)(int)dVar30 + (double)(int)dVar30 + 1.0;
        dVar25 = log(dVar30);
        dVar25 = exp2((double)(int)(dVar25 / 0.6931471805599453) + 2.0);
        iVar13 = (int)dVar25;
        local_98.forward_fft.ip = (int *)0x0;
        local_98.forward_fft.w = (double *)0x0;
        local_98.forward_fft.out = (double *)0x0;
        local_98.forward_fft.input = (double *)0x0;
        local_98.forward_fft.in = (double *)0x0;
        local_98.forward_fft.c_out = (fft_complex *)0x0;
        local_98.forward_fft.flags = 0;
        local_98.forward_fft._12_4_ = 0;
        local_98.forward_fft.c_in = (fft_complex *)0x0;
        local_98.spectrum = (fft_complex *)0x0;
        local_98.forward_fft.n = 0;
        local_98.forward_fft.sign = 0;
        local_98.fft_size = 0;
        local_98._4_4_ = 0;
        local_98.waveform = (double *)0x0;
        InitializeForwardRealFFT(iVar13,&local_98);
        uVar14 = (long)iVar13 << 4;
        if (iVar13 < 0) {
          uVar14 = 0xffffffffffffffff;
        }
        pvVar7 = operator_new__(uVar14);
        pvVar8 = operator_new__(uVar14);
        uVar14 = lVar5 * 4;
        if (iVar22 < 0) {
          uVar14 = 0xffffffffffffffff;
        }
        iVar34 = iVar22;
        pvVar9 = operator_new__(uVar14);
        pvVar10 = operator_new__(uVar20);
        pdVar11 = (double *)operator_new__(uVar20);
        if (-1 < iVar22) {
          dVar30 = dVar30 / dVar24;
          lVar15 = 0;
          do {
            iVar22 = matlab_round((*(double *)((long)pvVar6 + lVar15 * 8) + dVar27) * dVar24);
            *(int *)((long)pvVar9 + lVar15 * 4) = iVar22;
            lVar15 = lVar15 + 1;
          } while (uVar21 + 1 != lVar15);
          lVar15 = 0;
          do {
            dVar25 = ((double)*(int *)((long)pvVar9 + lVar15 * 4) + -1.0) / dVar24 - dVar27;
            dVar26 = cos((dVar25 * 6.283185307179586) / dVar30);
            dVar25 = cos((dVar25 * 12.566370614359172) / dVar30);
            *(double *)((long)pvVar10 + lVar15 * 8) = dVar25 * 0.08 + dVar26 * 0.5 + 0.42;
            lVar15 = lVar15 + 1;
          } while (uVar21 + 1 != lVar15);
        }
        *pdVar11 = *(double *)((long)pvVar10 + 8) * -0.5;
        if (0 < iVar34) {
          lVar15 = 0;
          do {
            pdVar11[lVar15 + 1] =
                 (*(double *)((long)pvVar10 + lVar15 * 8 + 0x10) -
                 *(double *)((long)pvVar10 + lVar15 * 8)) * -0.5;
            lVar15 = lVar15 + 1;
          } while (uVar21 - 1 != lVar15);
        }
        pdVar11[(int)uVar3] = *(double *)((long)pvVar10 + lVar5 * 8 + -0x10) * 0.5;
        pvVar12 = operator_new__(uVar14);
        if (-1 < iVar34) {
          lVar15 = 0;
          do {
            iVar22 = *(int *)((long)pvVar9 + lVar15 * 4) + -1;
            if (x_length + -1 < iVar22) {
              iVar22 = x_length + -1;
            }
            if (iVar22 < 1) {
              iVar22 = 0;
            }
            *(int *)((long)pvVar12 + lVar15 * 4) = iVar22;
            lVar15 = lVar15 + 1;
          } while (lVar5 != lVar15);
          lVar15 = 0;
          do {
            local_98.waveform[lVar15] =
                 x[*(int *)((long)pvVar12 + lVar15 * 4)] * *(double *)((long)pvVar10 + lVar15 * 8);
            lVar15 = lVar15 + 1;
          } while (lVar5 != lVar15);
        }
        iVar22 = iVar13;
        if (iVar2 < iVar13) {
          memset(local_98.waveform + lVar5,0,(ulong)((uVar3 ^ 0xfffffffe) + iVar13) * 8 + 8);
        }
        pfVar18 = &local_98.forward_fft;
        puVar19 = auStackY_1b8;
        for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar19 = *(undefined8 *)pfVar18;
          pfVar18 = (fft_plan *)((long)pfVar18 + ((ulong)bVar23 * -2 + 1) * 8);
          puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
        }
        p.c_out._0_4_ = iVar22;
        p.n = in_stack_fffffffffffffe70._0_4_;
        p.sign = in_stack_fffffffffffffe70._4_4_;
        p.flags = in_stack_fffffffffffffe70._8_4_;
        p._12_4_ = in_stack_fffffffffffffe70._12_4_;
        p.c_in = (fft_complex *)in_stack_fffffffffffffe70._16_8_;
        p.in = (double *)in_stack_fffffffffffffe70._24_8_;
        p.c_out._4_4_ = fs;
        p.out._0_4_ = SUB84(dVar30,0);
        p.out._4_4_ = (int)((ulong)dVar30 >> 0x20);
        p.input = (double *)dVar29;
        p.ip = (int *)pvVar9;
        p.w._0_4_ = iVar34;
        p.w._4_4_ = uVar36;
        fft_execute(p);
        iVar17 = iVar13 / 2;
        if (-2 < iVar13) {
          lVar15 = 0;
          do {
            *(undefined8 *)((long)pvVar7 + lVar15) =
                 *(undefined8 *)((long)*local_98.spectrum + lVar15);
            *(undefined8 *)((long)pvVar7 + lVar15 + 8) =
                 *(undefined8 *)((long)*local_98.spectrum + lVar15 + 8);
            lVar15 = lVar15 + 0x10;
          } while ((ulong)(iVar17 + 1) << 4 != lVar15);
        }
        uVar37 = 0;
        if (-1 < iVar34) {
          lVar15 = 0;
          do {
            local_98.waveform[lVar15] = x[*(int *)((long)pvVar12 + lVar15 * 4)] * pdVar11[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar5 != lVar15);
        }
        iVar13 = iVar22;
        if (iVar2 < iVar22) {
          memset(local_98.waveform + lVar5,0,(ulong)((uVar3 ^ 0xfffffffe) + iVar22) * 8 + 8);
        }
        pfVar18 = &local_98.forward_fft;
        puVar19 = auStackY_1b8;
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar19 = *(undefined8 *)pfVar18;
          pfVar18 = (fft_plan *)((long)pfVar18 + ((ulong)bVar23 * -2 + 1) * 8);
          puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
        }
        p_00.c_out._0_4_ = iVar13;
        p_00.n = in_stack_fffffffffffffe70._0_4_;
        p_00.sign = in_stack_fffffffffffffe70._4_4_;
        p_00.flags = in_stack_fffffffffffffe70._8_4_;
        p_00._12_4_ = in_stack_fffffffffffffe70._12_4_;
        p_00.c_in = (fft_complex *)in_stack_fffffffffffffe70._16_8_;
        p_00.in = (double *)in_stack_fffffffffffffe70._24_8_;
        p_00.c_out._4_4_ = fs;
        p_00.out._0_4_ = iVar17;
        p_00.out._4_4_ = uVar37;
        p_00.input = (double *)dVar29;
        p_00.ip = (int *)pvVar9;
        p_00.w._0_4_ = iVar34;
        p_00.w._4_4_ = uVar36;
        fft_execute(p_00);
        if (-2 < iVar22) {
          lVar5 = 0;
          do {
            *(undefined8 *)((long)pvVar8 + lVar5) =
                 *(undefined8 *)((long)*local_98.spectrum + lVar5);
            *(undefined8 *)((long)pvVar8 + lVar5 + 8) =
                 *(undefined8 *)((long)*local_98.spectrum + lVar5 + 8);
            lVar5 = lVar5 + 0x10;
          } while ((ulong)(iVar17 + 1) << 4 != lVar5);
        }
        operator_delete__(pvVar12);
        uVar20 = (long)iVar17 * 8 + 8;
        if (iVar22 < -3) {
          uVar20 = 0xffffffffffffffff;
        }
        power_spectrum = (double *)operator_new__(uVar20);
        numerator_i = (double *)operator_new__(uVar20);
        if (-2 < iVar22) {
          uVar20 = (ulong)(iVar17 + 1);
          lVar5 = 0;
          do {
            dVar27 = *(double *)((long)pvVar7 + lVar5 * 2);
            dVar30 = *(double *)((long)pvVar7 + lVar5 * 2 + 8);
            *(double *)((long)numerator_i + lVar5) =
                 *(double *)((long)pvVar8 + lVar5 * 2 + 8) * dVar27 -
                 *(double *)((long)pvVar8 + lVar5 * 2) * dVar30;
            *(double *)((long)power_spectrum + lVar5) = dVar27 * dVar27 + dVar30 * dVar30;
            lVar5 = lVar5 + 8;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
        dVar27 = anon_unknown_0::FixF0(power_spectrum,numerator_i,iVar13,fs,initial_f0,2);
        dVar30 = 0.0;
        if ((0.0 < dVar27) && (dVar27 <= initial_f0 + initial_f0)) {
          dVar30 = anon_unknown_0::FixF0(power_spectrum,numerator_i,iVar13,fs,dVar27,6);
        }
        uVar36 = SUB84(dVar30,0);
        uVar37 = (undefined4)((ulong)dVar30 >> 0x20);
        operator_delete__(pvVar8);
        operator_delete__(pdVar11);
        operator_delete__(pvVar10);
        operator_delete__(pvVar9);
        operator_delete__(numerator_i);
        operator_delete__(power_spectrum);
        operator_delete__(pvVar7);
        DestroyForwardRealFFT(&local_98);
        uVar20 = -(ulong)(initial_f0 * 0.2 < ABS((double)CONCAT44(uVar37,uVar36) - initial_f0));
        uVar20 = ~uVar20 & CONCAT44(uVar37,uVar36) | (ulong)initial_f0 & uVar20;
        uVar36 = (undefined4)uVar20;
        uVar37 = (undefined4)(uVar20 >> 0x20);
        operator_delete__(pvVar6);
        dVar27 = (double)CONCAT44(uVar37,uVar36);
      }
      refined_f0[uVar16] = dVar27;
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uint)f0_length);
  }
  return;
}

Assistant:

void StoneMask(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    double *refined_f0) {
  for (int i = 0; i < f0_length; i++)
    refined_f0[i] =
      GetRefinedF0(x, x_length, fs, temporal_positions[i], f0[i]);
}